

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O2

int anon_unknown.dwarf_3d90f::xOpen
              (sqlite3_vfs *svfs,sqlite3_filename zName,sqlite3_file *sfile,int flags,int *pOutFlags
              )

{
  char cVar1;
  int iVar2;
  sqlite3_io_methods *this;
  char cVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  sqlite3_filename zName_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sfile->pMethods = (sqlite3_io_methods *)0x0;
  sfile[1].pMethods = (sqlite3_io_methods *)0x0;
  zName_local = zName;
  if ((char)(byte)flags < '\0' || zName == (sqlite3_filename)0x0) {
    iVar2 = 3;
  }
  else {
    if ((flags & 0xfU) == 1) {
      cVar1 = '\x01';
    }
    else {
      cVar3 = ((~flags & 0x14U) == 0) * '@';
      cVar1 = cVar3 + '\x03';
      if ((flags & 2U) == 0) {
        cVar1 = cVar3;
      }
    }
    sfile->pMethods = (sqlite3_io_methods *)&svfs[1].mxPathname;
    this = (sqlite3_io_methods *)operator_new(0x18);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_68,&zName_local);
    QVar4.m_data = (storage_type_conflict *)local_68.m_size;
    QVar4.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar4);
    QFile::QFile((QFile *)this,(QString *)&local_58);
    *(undefined ***)this = &PTR_metaObject_00227e90;
    *(byte *)&this->xRead = (byte)flags >> 3 & 1;
    sfile[1].pMethods = this;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    cVar1 = (**(code **)(*(long *)sfile[1].pMethods + 0x68))(sfile[1].pMethods,cVar1);
    if (cVar1 == '\0') {
      iVar2 = 0xe;
    }
    else {
      iVar2 = 0;
      if (pOutFlags != (int *)0x0) {
        *pOutFlags = flags;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int xOpen(sqlite3_vfs *svfs, sqlite3_filename zName, sqlite3_file *sfile,
          int flags, int *pOutFlags)
{
    auto vfs = static_cast<Vfs *>(svfs);
    auto file = static_cast<File *>(sfile);
    memset(file, 0, sizeof(File));
    QIODeviceBase::OpenMode mode = QIODeviceBase::NotOpen;
    if (!zName || (flags & SQLITE_OPEN_MEMORY))
        return SQLITE_PERM;
    if ((flags & SQLITE_OPEN_READONLY) &&
        !(flags & SQLITE_OPEN_READWRITE) &&
        !(flags & SQLITE_OPEN_CREATE) &&
        !(flags & SQLITE_OPEN_DELETEONCLOSE)) {
        mode |= QIODeviceBase::OpenModeFlag::ReadOnly;
    } else {
        /*
            ** ^The [SQLITE_OPEN_EXCLUSIVE] flag is always used in conjunction
            ** with the [SQLITE_OPEN_CREATE] flag, which are both directly
            ** analogous to the O_EXCL and O_CREAT flags of the POSIX open()
            ** API.  The SQLITE_OPEN_EXCLUSIVE flag, when paired with the
            ** SQLITE_OPEN_CREATE, is used to indicate that file should always
            ** be created, and that it is an error if it already exists.
            ** It is <i>not</i> used to indicate the file should be opened
            ** for exclusive access.
         */
        if ((flags & SQLITE_OPEN_CREATE) && (flags & SQLITE_OPEN_EXCLUSIVE))
            mode |= QIODeviceBase::OpenModeFlag::NewOnly;

        if (flags & SQLITE_OPEN_READWRITE)
            mode |= QIODeviceBase::OpenModeFlag::ReadWrite;
    }

    file->pMethods = &vfs->ioMethods;
    file->pFile = new File::QtFile(QString::fromUtf8(zName), bool(flags & SQLITE_OPEN_DELETEONCLOSE));
    if (!file->pFile->open(mode))
        return SQLITE_CANTOPEN;
    if (pOutFlags)
        *pOutFlags = flags;

    return SQLITE_OK;
}